

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScrollAdapterBase.cpp
# Opt level: O2

size_t __thiscall
cursespp::ScrollAdapterBase::GetVisibleItems
          (ScrollAdapterBase *this,ScrollableWindow *window,size_t desiredTopIndex,
          deque<std::shared_ptr<cursespp::IScrollAdapter::IEntry>,_std::allocator<std::shared_ptr<cursespp::IScrollAdapter::IEntry>_>_>
          *target)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  size_t sVar6;
  long lVar7;
  uint uVar8;
  EntryPtr entry;
  value_type local_58;
  deque<std::shared_ptr<cursespp::IScrollAdapter::IEntry>,_std::allocator<std::shared_ptr<cursespp::IScrollAdapter::IEntry>_>_>
  *local_48;
  ScrollableWindow *local_40;
  size_t local_38;
  
  sVar6 = this->height;
  local_48 = target;
  local_40 = window;
  iVar2 = (*(this->super_IScrollAdapter)._vptr_IScrollAdapter[3])();
  lVar7 = (long)(int)desiredTopIndex;
  local_38 = desiredTopIndex;
  while ((uVar8 = (uint)sVar6, lVar7 < iVar2 && (0 < (int)uVar8))) {
    (*(this->super_IScrollAdapter)._vptr_IScrollAdapter[4])(&local_58,this,local_40,lVar7);
    (*(local_58.super___shared_ptr<cursespp::IScrollAdapter::IEntry,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr)->_vptr_IEntry[4])
              (local_58.
               super___shared_ptr<cursespp::IScrollAdapter::IEntry,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr,this->width);
    uVar3 = (*(local_58.
               super___shared_ptr<cursespp::IScrollAdapter::IEntry,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->_vptr_IEntry[2])();
    std::
    deque<std::shared_ptr<cursespp::IScrollAdapter::IEntry>,_std::allocator<std::shared_ptr<cursespp::IScrollAdapter::IEntry>_>_>
    ::push_back(local_48,&local_58);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_58.
                super___shared_ptr<cursespp::IScrollAdapter::IEntry,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    lVar7 = lVar7 + 1;
    sVar6 = (ulong)(uVar8 & 0x7fffffff) - (ulong)uVar3;
  }
  if (0 < (int)uVar8) {
    std::
    deque<std::shared_ptr<cursespp::IScrollAdapter::IEntry>,_std::allocator<std::shared_ptr<cursespp::IScrollAdapter::IEntry>_>_>
    ::clear(local_48);
    sVar6 = this->height;
    iVar2 = (*(this->super_IScrollAdapter)._vptr_IScrollAdapter[3])(this);
    uVar8 = iVar2 - 1;
    iVar2 = (int)sVar6;
    do {
      if (((int)uVar8 < 0) || (iVar2 < 0)) break;
      (*(this->super_IScrollAdapter)._vptr_IScrollAdapter[4])(&local_58,this,local_40,(ulong)uVar8);
      (*(local_58.super___shared_ptr<cursespp::IScrollAdapter::IEntry,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr)->_vptr_IEntry[4])
                (local_58.
                 super___shared_ptr<cursespp::IScrollAdapter::IEntry,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr,this->width);
      iVar4 = (*(local_58.
                 super___shared_ptr<cursespp::IScrollAdapter::IEntry,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr)->_vptr_IEntry[2])();
      iVar5 = iVar2;
      if (iVar4 <= iVar2) {
        std::
        deque<std::shared_ptr<cursespp::IScrollAdapter::IEntry>,_std::allocator<std::shared_ptr<cursespp::IScrollAdapter::IEntry>_>_>
        ::push_front(local_48,&local_58);
        uVar8 = uVar8 - 1;
        iVar5 = iVar2 - iVar4;
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_58.
                  super___shared_ptr<cursespp::IScrollAdapter::IEntry,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      bVar1 = iVar4 <= iVar2;
      iVar2 = iVar5;
    } while (bVar1);
    local_38 = (size_t)(int)(uVar8 + 1);
  }
  return local_38;
}

Assistant:

size_t ScrollAdapterBase::GetVisibleItems(
    cursespp::ScrollableWindow* window,
    size_t desiredTopIndex,
    std::deque<EntryPtr>& target)
{
    size_t actualTopIndex = desiredTopIndex;

    /* ensure we have enough data to draw from the specified position
    to the end. if we don't try to back up a bit until we can fill
    the buffer */
    int totalHeight = (int) this->height;
    int entryCount = (int) this->GetEntryCount();

    /* we assume the general case -- we're some where in the middle of the
    list. we'll start from the specified first item and work our way down */
    for (int i = (int) desiredTopIndex; i < entryCount && totalHeight > 0; i++) {
        EntryPtr entry = this->GetEntry(window, i);
        entry->SetWidth(this->width);
        totalHeight -= entry->GetLineCount();
        target.push_back(entry);
    }

    /* however, if the list is short, we can actually draw more items above
    the specified one. let's work our way backwards! */
    if (totalHeight > 0) {
        target.clear();

        totalHeight = this->height;
        int i = GetEntryCount() - 1;
        while (i >= 0 && totalHeight >= 0) {
            EntryPtr entry = this->GetEntry(window, i);
            entry->SetWidth(this->width);

            int lines = entry->GetLineCount();
            if (lines > totalHeight) {
                break; /* this Entry won't fit. bail. */
            }

            totalHeight -= lines;
            target.push_front(entry);
            --i;
        }

        actualTopIndex = i + 1;
    }

    return actualTopIndex;
}